

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minesweeper.cpp
# Opt level: O0

void __thiscall
minesweeper::MinefieldGenerator::UpdateCell
          (MinefieldGenerator *this,uint16_t i,uint16_t j,string *data)

{
  char *pcVar1;
  undefined4 local_28;
  undefined4 local_24;
  int a;
  int b;
  string *data_local;
  uint16_t j_local;
  uint16_t i_local;
  MinefieldGenerator *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)data);
  if (*pcVar1 == '*') {
    for (local_24 = j - 1; local_24 <= (int)(j + 1); local_24 = local_24 + 1) {
      for (local_28 = i - 1; local_28 <= (int)(i + 1); local_28 = local_28 + 1) {
        TryIncrement(this,(int8_t)local_28,(int8_t)local_24,data);
      }
    }
  }
  return;
}

Assistant:

void UpdateCell(std::uint16_t i, std::uint16_t j, std::string& data) const
		{
			if ( data[i + j * m_width] == '*' )
				for (auto b = j - 1; b <= j + 1; ++b)
					for (auto a = i - 1; a <= i + 1; ++a)
						TryIncrement(a, b, data);
		}